

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O2

void __thiscall argo::lexer::read_string(lexer *this)

{
  int iVar1;
  size_t sVar2;
  json_parser_exception *this_00;
  size_t byte_index;
  ulong len;
  bool bVar3;
  token local_50;
  
  bVar3 = false;
  len = 0;
  do {
    iVar1 = (*this->m_reader->_vptr_reader[2])();
    if (iVar1 < 0x10) {
      this_00 = (json_parser_exception *)__cxa_allocate_exception(0xe0);
      sVar2 = reader::get_byte_index(this->m_reader);
      json_parser_exception::json_parser_exception(this_00,invalid_character_e,(char)iVar1,sVar2);
LAB_001133d5:
      __cxa_throw(this_00,&json_parser_exception::typeinfo,std::exception::~exception);
    }
    if (!(bool)(bVar3 | iVar1 != 0x22)) {
      token::token(&local_50,string_e,this->m_buffer,len);
      token::operator=(&this->m_token,&local_50);
      token::~token(&local_50);
      return;
    }
    if (this->m_max_token_length <= len) {
      this_00 = (json_parser_exception *)__cxa_allocate_exception(0xe0);
      sVar2 = this->m_max_token_length;
      byte_index = reader::get_byte_index(this->m_reader);
      json_parser_exception::json_parser_exception(this_00,string_too_long_e,sVar2,byte_index);
      goto LAB_001133d5;
    }
    this->m_buffer[len] = (char)iVar1;
    len = len + 1;
    bVar3 = iVar1 == 0x5c;
  } while( true );
}

Assistant:

void lexer::read_string()
{
    size_t n = 0;
    bool in_escape = false;

    while (true)
    {
        int c;

        c = m_reader.next();
        if (c <= 0xf)
        {
            throw json_parser_exception(
                        json_parser_exception::invalid_character_e,
                        static_cast<char>(c),
                        m_reader.get_byte_index());
        }
        else if (c == '"' && !in_escape)
        {
            m_token = token(token::string_e, m_buffer, n);
            return;
        }
        else
        {
            if (n >= m_max_token_length)
            {
                throw json_parser_exception(
                            json_parser_exception::string_too_long_e,
                            m_max_token_length,
                            m_reader.get_byte_index());
            }
            else
            {
                m_buffer[n++] = c;
            }
        }
        in_escape = (c == '\\');
    }
}